

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCall.cpp
# Opt level: O2

FunctionCall * __thiscall ninx::parser::element::FunctionCall::clone_impl(FunctionCall *this)

{
  pointer puVar1;
  FunctionCall *this_00;
  pointer *__ptr;
  pointer puVar2;
  undefined1 local_78 [16];
  vector<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
  arguments_copy;
  vector<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
  local_48;
  
  arguments_copy.
  super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  arguments_copy.
  super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  arguments_copy.
  super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar1 = (this->arguments).
           super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar2 = (this->arguments).
                super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    ASTElement::clone<ninx::parser::element::FunctionCallArgument>((ASTElement *)local_78);
    std::
    vector<std::unique_ptr<ninx::parser::element::FunctionCallArgument,std::default_delete<ninx::parser::element::FunctionCallArgument>>,std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,std::default_delete<ninx::parser::element::FunctionCallArgument>>>>
    ::
    emplace_back<std::unique_ptr<ninx::parser::element::FunctionCallArgument,std::default_delete<ninx::parser::element::FunctionCallArgument>>>
              ((vector<std::unique_ptr<ninx::parser::element::FunctionCallArgument,std::default_delete<ninx::parser::element::FunctionCallArgument>>,std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,std::default_delete<ninx::parser::element::FunctionCallArgument>>>>
                *)&arguments_copy,
               (unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
                *)local_78);
    if ((Block *)local_78._0_8_ != (Block *)0x0) {
      (*(((Statement *)&((ASTElement *)local_78._0_8_)->_vptr_ASTElement)->super_ASTElement).
        _vptr_ASTElement[1])();
    }
  }
  if ((this->outer_argument)._M_t.
      super___uniq_ptr_impl<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
      ._M_t.
      super__Tuple_impl<0UL,_ninx::parser::element::FunctionCallArgument_*,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
      .super__Head_base<0UL,_ninx::parser::element::FunctionCallArgument_*,_false>._M_head_impl ==
      (FunctionCallArgument *)0x0) {
    local_78._8_8_ = (Block *)0x0;
  }
  else {
    ASTElement::clone<ninx::parser::element::FunctionCallArgument>((ASTElement *)local_78);
    local_78._8_8_ = local_78._0_8_;
  }
  this_00 = (FunctionCall *)operator_new(0x60);
  local_48.
  super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       arguments_copy.
       super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_48.
  super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       arguments_copy.
       super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_48.
  super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       arguments_copy.
       super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  arguments_copy.
  super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  arguments_copy.
  super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  arguments_copy.
  super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  FunctionCall(this_00,&this->name,&local_48,
               (unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
                *)(local_78 + 8),this->late_call);
  if ((FunctionCallArgument *)local_78._8_8_ != (FunctionCallArgument *)0x0) {
    (**(code **)(*(_func_int **)local_78._8_8_ + 8))();
  }
  std::
  vector<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
  ::~vector(&local_48);
  std::
  vector<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
  ::~vector(&arguments_copy);
  return this_00;
}

Assistant:

ninx::parser::element::FunctionCall *ninx::parser::element::FunctionCall::clone_impl() {
    // Clone all the arguments
    std::vector<std::unique_ptr<FunctionCallArgument>> arguments_copy;
    for (auto &argument : arguments) {
        auto argument_copy {argument->clone<FunctionCallArgument>()};
        arguments_copy.push_back(std::move(argument_copy));
    }

    // Clone the outer argument if present
    std::unique_ptr<FunctionCallArgument> outer_argument_copy {nullptr};
    if (this->outer_argument) {
        outer_argument_copy = outer_argument->clone<FunctionCallArgument>();
    }

    return new FunctionCall(this->name, std::move(arguments_copy), std::move(outer_argument_copy), late_call);
}